

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdjs_script.cpp
# Opt level: O2

ScriptDataResponseStruct *
cfd::js::api::ScriptStructApi::CreateScript
          (ScriptDataResponseStruct *__return_storage_ptr__,CreateScriptRequestStruct *request)

{
  string *in_R8;
  allocator local_119;
  _Any_data local_118;
  code *local_108;
  code *local_100;
  function<cfd::js::api::ScriptDataResponseStruct_(const_cfd::js::api::CreateScriptRequestStruct_&)>
  local_f8;
  ScriptDataResponseStruct local_d8;
  
  ScriptDataResponseStruct::ScriptDataResponseStruct(__return_storage_ptr__);
  local_118._M_unused._M_object = (void *)0x0;
  local_118._8_8_ = 0;
  local_100 = std::
              _Function_handler<cfd::js::api::ScriptDataResponseStruct_(const_cfd::js::api::CreateScriptRequestStruct_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/src/cfdjs_script.cpp:64:20)>
              ::_M_invoke;
  local_108 = std::
              _Function_handler<cfd::js::api::ScriptDataResponseStruct_(const_cfd::js::api::CreateScriptRequestStruct_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/src/cfdjs_script.cpp:64:20)>
              ::_M_manager;
  std::__cxx11::string::string((string *)&local_f8,"CreateScript",&local_119);
  ExecuteStructApi<cfd::js::api::CreateScriptRequestStruct,cfd::js::api::ScriptDataResponseStruct>
            (&local_d8,(api *)request,(CreateScriptRequestStruct *)&local_118,&local_f8,in_R8);
  ScriptDataResponseStruct::operator=(__return_storage_ptr__,&local_d8);
  ScriptDataResponseStruct::~ScriptDataResponseStruct(&local_d8);
  std::__cxx11::string::~string((string *)&local_f8);
  std::_Function_base::~_Function_base((_Function_base *)&local_118);
  return __return_storage_ptr__;
}

Assistant:

ScriptDataResponseStruct ScriptStructApi::CreateScript(
    const CreateScriptRequestStruct& request) {
  auto call_func = [](const CreateScriptRequestStruct& request)
      -> ScriptDataResponseStruct {
    ScriptDataResponseStruct response;

    if (request.items.size() == 0) {
      warn(CFD_LOG_SOURCE, "empty script items.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to CreateScript. empty script items.");
    }

    ScriptBuilder sb = ScriptBuilder();
    for (const auto& item : request.items) {
      sb.AppendString(item);
    }
    Script script = sb.Build();

    response.hex = script.GetHex();
    return response;
  };

  ScriptDataResponseStruct result;
  result =
      ExecuteStructApi<CreateScriptRequestStruct, ScriptDataResponseStruct>(
          request, call_func, std::string(__FUNCTION__));
  return result;
}